

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int luaG_traceexec(lua_State *L,Instruction *pc)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  CallInfo *pCVar4;
  Proto *f;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int pc_00;
  int iVar10;
  
  pCVar4 = L->ci;
  uVar2 = L->hookmask;
  if ((uVar2 & 0xc) == 0) {
    (pCVar4->u).l.trap = 0;
    return 0;
  }
  f = *(Proto **)((((pCVar4->func).p)->val).value_.f + 0x18);
  (pCVar4->u).l.savedpc = pc + 1;
  if ((uVar2 & 8) == 0) {
LAB_00107487:
    if ((uVar2 & 4) == 0) {
      return 1;
    }
    bVar5 = false;
  }
  else {
    piVar1 = &L->hookcount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_00107487;
    L->hookcount = L->basehookcount;
    bVar5 = true;
  }
  if ((pCVar4->callstatus & 0x40) != 0) {
    pCVar4->callstatus = pCVar4->callstatus & 0xffbf;
    return 1;
  }
  uVar3 = *(uint *)((pCVar4->u).c.k + -4);
  if (((uVar3 & 0xff0000) != 0) || (("\b\n\n\t\t\b\b\b\b\b"[uVar3 & 0x7f] & 0x20) == 0)) {
    L->top = pCVar4->top;
  }
  if (bVar5) {
    luaD_hook(L,3,-1,0,0);
  }
  if ((uVar2 & 4) == 0) goto LAB_001075bf;
  iVar7 = 0;
  if (L->oldpc < f->sizecode) {
    iVar7 = L->oldpc;
  }
  iVar6 = (int)((ulong)((long)(pc + 1) - (long)f->code) >> 2);
  pc_00 = iVar6 + -1;
  if (pc_00 <= iVar7) goto LAB_0010759b;
  if (f->lineinfo != (ls_byte *)0x0) {
    if (pc_00 - iVar7 < 0x40) {
      iVar8 = 0;
      lVar9 = 1;
      do {
        iVar10 = (int)f->lineinfo[lVar9 + iVar7];
        if (iVar10 == -0x80) goto LAB_00107581;
        iVar8 = iVar8 + iVar10;
        lVar9 = lVar9 + 1;
      } while (iVar6 - iVar7 != (int)lVar9);
      if (iVar8 != 0) goto LAB_0010759b;
    }
    else {
LAB_00107581:
      iVar7 = luaG_getfuncline(f,iVar7);
      iVar6 = luaG_getfuncline(f,pc_00);
      if (iVar7 != iVar6) {
LAB_0010759b:
        iVar7 = luaG_getfuncline(f,pc_00);
        luaD_hook(L,2,iVar7,0,0);
      }
    }
  }
  L->oldpc = pc_00;
LAB_001075bf:
  if (L->status != '\x01') {
    return 1;
  }
  if (bVar5) {
    L->hookcount = 1;
  }
  *(byte *)&pCVar4->callstatus = (byte)pCVar4->callstatus | 0x40;
  luaD_throw(L,1);
}

Assistant:

int luaG_traceexec (lua_State *L, const Instruction *pc) {
  CallInfo *ci = L->ci;
  lu_byte mask = L->hookmask;
  const Proto *p = ci_func(ci)->p;
  int counthook;
  if (!(mask & (LUA_MASKLINE | LUA_MASKCOUNT))) {  /* no hooks? */
    ci->u.l.trap = 0;  /* don't need to stop again */
    return 0;  /* turn off 'trap' */
  }
  pc++;  /* reference is always next instruction */
  ci->u.l.savedpc = pc;  /* save 'pc' */
  counthook = (mask & LUA_MASKCOUNT) && (--L->hookcount == 0);
  if (counthook)
    resethookcount(L);  /* reset count */
  else if (!(mask & LUA_MASKLINE))
    return 1;  /* no line hook and count != 0; nothing to be done now */
  if (ci->callstatus & CIST_HOOKYIELD) {  /* hook yielded last time? */
    ci->callstatus &= ~CIST_HOOKYIELD;  /* erase mark */
    return 1;  /* do not call hook again (VM yielded, so it did not move) */
  }
  if (!isIT(*(ci->u.l.savedpc - 1)))  /* top not being used? */
    L->top.p = ci->top.p;  /* correct top */
  if (counthook)
    luaD_hook(L, LUA_HOOKCOUNT, -1, 0, 0);  /* call count hook */
  if (mask & LUA_MASKLINE) {
    /* 'L->oldpc' may be invalid; use zero in this case */
    int oldpc = (L->oldpc < p->sizecode) ? L->oldpc : 0;
    int npci = pcRel(pc, p);
    if (npci <= oldpc ||  /* call hook when jump back (loop), */
        changedline(p, oldpc, npci)) {  /* or when enter new line */
      int newline = luaG_getfuncline(p, npci);
      luaD_hook(L, LUA_HOOKLINE, newline, 0, 0);  /* call line hook */
    }
    L->oldpc = npci;  /* 'pc' of last call to line hook */
  }
  if (L->status == LUA_YIELD) {  /* did hook yield? */
    if (counthook)
      L->hookcount = 1;  /* undo decrement to zero */
    ci->callstatus |= CIST_HOOKYIELD;  /* mark that it yielded */
    luaD_throw(L, LUA_YIELD);
  }
  return 1;  /* keep 'trap' on */
}